

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

size_t __thiscall
anon_unknown.dwarf_2c0471::root_dir_start(anon_unknown_dwarf_2c0471 *this,StringRef str,Style style)

{
  anon_unknown_dwarf_2c0471 aVar1;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  StringRef Chars;
  StringRef local_10;
  
  local_10.Length = (size_t)str.Data;
  iVar3 = (int)str.Length;
  if (((char *)0x2 < local_10.Length && iVar3 == 0) && (this[1] == (anon_unknown_dwarf_2c0471)0x3a))
  {
    if (this[2] == (anon_unknown_dwarf_2c0471)0x2f) {
      return 2;
    }
    if (iVar3 == 0 && this[2] == (anon_unknown_dwarf_2c0471)0x5c) {
      return 2;
    }
  }
  if ((local_10.Length < (char *)0x4) ||
     ((((aVar1 = *this, aVar1 != (anon_unknown_dwarf_2c0471)0x2f &&
        (aVar1 != (anon_unknown_dwarf_2c0471)0x5c || iVar3 != 0)) || (aVar1 != this[1])) ||
      ((this[2] == (anon_unknown_dwarf_2c0471)0x2f ||
       (iVar3 == 0 && this[2] == (anon_unknown_dwarf_2c0471)0x5c)))))) {
    if (((char *)local_10.Length == (char *)0x0) ||
       ((*this != (anon_unknown_dwarf_2c0471)0x2f &&
        (iVar3 != 0 || *this != (anon_unknown_dwarf_2c0471)0x5c)))) {
      sVar2 = 0xffffffffffffffff;
    }
    else {
      sVar2 = 0;
    }
  }
  else {
    pcVar4 = "/";
    if (iVar3 == 0) {
      pcVar4 = "\\/";
    }
    Chars.Length = (ulong)(iVar3 == 0) + 1;
    Chars.Data = pcVar4;
    local_10.Data = (char *)this;
    sVar2 = llvm::StringRef::find_first_of(&local_10,Chars,2);
  }
  return sVar2;
}

Assistant:

size_t root_dir_start(StringRef str, Style style) {
    // case "c:/"
    if (real_style(style) == Style::windows) {
      if (str.size() > 2 && str[1] == ':' && is_separator(str[2], style))
        return 2;
    }

    // case "//net"
    if (str.size() > 3 && is_separator(str[0], style) && str[0] == str[1] &&
        !is_separator(str[2], style)) {
      return str.find_first_of(separators(style), 2);
    }

    // case "/"
    if (str.size() > 0 && is_separator(str[0], style))
      return 0;

    return StringRef::npos;
  }